

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O3

Aig_Obj_t ** Aig_ManStaticFanoutStart(Aig_Man_t *p)

{
  void *pvVar1;
  ulong uVar2;
  Aig_Obj_t **ppAVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  
  pVVar8 = p->vObjs;
  iVar6 = pVVar8->nSize;
  iVar5 = iVar6 * 2 - (p->nObjs[2] + p->nObjs[3]);
  ppAVar3 = (Aig_Obj_t **)malloc((long)iVar5 << 3);
  if (iVar6 < 1) {
    if (iVar5 < 1) goto LAB_006f7060;
  }
  else {
    lVar4 = 0;
    iVar6 = 0;
    do {
      pvVar1 = pVVar8->pArray[lVar4];
      if (pvVar1 != (void *)0x0) {
        *(Aig_Obj_t ***)((long)pvVar1 + 0x28) = ppAVar3 + iVar6;
        iVar6 = iVar6 + ((uint)(*(ulong *)((long)pvVar1 + 0x18) >> 6) & 0x3ffffff);
        *(ulong *)((long)pvVar1 + 0x18) = *(ulong *)((long)pvVar1 + 0x18) & 0xffffffff0000003f;
        pVVar8 = p->vObjs;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar8->nSize);
    if (iVar5 <= iVar6) {
LAB_006f7060:
      __assert_fail("nFanouts < nFanoutsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetFwd.c"
                    ,0x42,"Aig_Obj_t **Aig_ManStaticFanoutStart(Aig_Man_t *)");
    }
    if (0 < pVVar8->nSize) {
      lVar4 = 0;
      do {
        pvVar1 = pVVar8->pArray[lVar4];
        if (pvVar1 != (void *)0x0) {
          if (*(ulong *)((long)pvVar1 + 8) != 0) {
            uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
            uVar2 = *(ulong *)(uVar7 + 0x18);
            *(ulong *)(uVar7 + 0x18) =
                 uVar2 & 0xffffffff0000003f | (ulong)((int)uVar2 + 0x40U & 0xffffffc0);
            *(void **)(*(long *)(uVar7 + 0x28) + (uVar2 >> 6 & 0x3ffffff) * 8) = pvVar1;
          }
          if (*(ulong *)((long)pvVar1 + 0x10) != 0) {
            uVar7 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
            uVar2 = *(ulong *)(uVar7 + 0x18);
            *(ulong *)(uVar7 + 0x18) =
                 uVar2 & 0xffffffff0000003f | (ulong)((int)uVar2 + 0x40U & 0xffffffc0);
            *(void **)(*(long *)(uVar7 + 0x28) + (uVar2 >> 6 & 0x3ffffff) * 8) = pvVar1;
          }
        }
        lVar4 = lVar4 + 1;
        pVVar8 = p->vObjs;
      } while (lVar4 < pVVar8->nSize);
    }
  }
  return ppAVar3;
}

Assistant:

Aig_Obj_t ** Aig_ManStaticFanoutStart( Aig_Man_t * p )
{
    Aig_Obj_t ** ppFanouts, * pObj;
    int i, nFanouts, nFanoutsAlloc;
    // allocate fanouts
    nFanoutsAlloc = 2 * Aig_ManObjNumMax(p) - Aig_ManCiNum(p) - Aig_ManCoNum(p);
    ppFanouts = ABC_ALLOC( Aig_Obj_t *, nFanoutsAlloc );
    // mark up storage
    nFanouts = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        pObj->pData = ppFanouts + nFanouts;
        nFanouts += pObj->nRefs;  
        pObj->nRefs = 0;
    }
    assert( nFanouts < nFanoutsAlloc ); 
    // add fanouts
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjChild0(pObj) )
            Aig_ObjSetFanoutStatic( Aig_ObjFanin0(pObj), pObj );
        if ( Aig_ObjChild1(pObj) )
            Aig_ObjSetFanoutStatic( Aig_ObjFanin1(pObj), pObj );
    }
    return ppFanouts;
}